

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  long lVar3;
  undefined1 auVar4 [8];
  int iVar5;
  undefined1 local_70 [8];
  string arg_string;
  string flagfile_value;
  
  arg_string.field_2._8_8_ = &flagfile_value._M_string_length;
  flagfile_value._M_dataplus._M_p = (pointer)0x0;
  flagfile_value._M_string_length._0_1_ = 0;
  auVar4 = (undefined1  [8])argc;
  if (1 < *argc) {
    iVar5 = 1;
    do {
      StreamableToString<char*>((string *)local_70,(internal *)(argv + iVar5),in_RDX);
      auVar4 = local_70;
      bVar1 = ParseGoogleTestFlag((char *)local_70);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_00133ff9:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = argv + (long)iVar5 + 1;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>
                          ((char *)auVar4,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&arg_string.field_2 + 8));
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          LoadFlagsFromFile((string *)((long)&arg_string.field_2 + 8));
          in_RDX = extraout_RDX_00;
          goto LAB_00133ff9;
        }
        iVar2 = std::__cxx11::string::compare(local_70);
        in_RDX = extraout_RDX_02;
        if ((iVar2 == 0) ||
           (bVar1 = HasGoogleTestFlagPrefix((char *)auVar4), in_RDX = extraout_RDX_03, bVar1)) {
          g_help_flag = '\x01';
        }
      }
      auVar4 = local_70;
      if (local_70 != (undefined1  [8])&arg_string._M_string_length) {
        operator_delete((void *)local_70,arg_string._M_string_length + 1);
        in_RDX = extraout_RDX_01;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded((char *)auVar4);
  }
  if ((size_type *)arg_string.field_2._8_8_ != &flagfile_value._M_string_length) {
    operator_delete((void *)arg_string.field_2._8_8_,
                    CONCAT71(flagfile_value._M_string_length._1_7_,
                             (undefined1)flagfile_value._M_string_length) + 1);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  std::string flagfile_value;
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (ParseFlag(arg, "flagfile", &flagfile_value)) {
      GTEST_FLAG_SET(flagfile, flagfile_value);
      LoadFlagsFromFile(flagfile_value);
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (arg_string == "--help" || HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}